

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O3

void __thiscall ON_Annotation::ClearFieldOverride(ON_Annotation *this,field field)

{
  ON_DimStyle *this_00;
  bool bVar1;
  ON_DimStyle *nullstyle;
  ON_DimStyle *local_18;
  
  this_00 = this->m_override_dimstyle;
  if (this_00 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetFieldOverride(this_00,field,false);
    bVar1 = ON_DimStyle::HasOverrides(this_00);
    if (!bVar1) {
      local_18 = (ON_DimStyle *)0x0;
      SetOverrideDimensionStyle(this,&local_18);
    }
  }
  return;
}

Assistant:

ON_DimStyle* ON_Annotation::Internal_GetOverrideStyle(bool bCreateIfNull) const
{
  if (nullptr == m_override_dimstyle && bCreateIfNull)
  {
    ON_DimStyle* style = new ON_DimStyle;
    SetOverrideDimensionStyle(style);
  }
  return m_override_dimstyle;
}